

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

string * __thiscall
tinyusdz::value::print_array_snipped<std::array<char,4ul>>
          (string *__return_storage_ptr__,value *this,array<char,_4UL> *vals,size_t n,size_t N)

{
  char *pcVar1;
  size_t i;
  undefined1 *puVar2;
  size_t i_1;
  value *pvVar3;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (n == 0 || vals <= (array<char,_4UL> *)(n * 2)) {
    ::std::operator<<(local_1a8,"[");
    for (pcVar1 = (char *)0x0; vals != (array<char,_4UL> *)pcVar1; pcVar1 = pcVar1 + 1) {
      if (pcVar1 != (char *)0x0) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::operator<<(local_1a8,(char4 *)this);
      this = this + 4;
    }
  }
  else {
    pcVar1 = (char *)((long)vals - n);
    if (vals < n) {
      n = (size_t)vals;
    }
    ::std::operator<<(local_1a8,"[");
    pvVar3 = this;
    for (puVar2 = (undefined1 *)0x0; (undefined1 *)n != puVar2; puVar2 = puVar2 + 1) {
      if (puVar2 != (undefined1 *)0x0) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::operator<<(local_1a8,(char4 *)pvVar3);
      pvVar3 = pvVar3 + 4;
    }
    if (n < pcVar1) {
      n = (size_t)pcVar1;
    }
    ::std::operator<<(local_1a8,", ..., ");
    pvVar3 = this + n * 4;
    for (pcVar1 = (char *)n; pcVar1 < vals; pcVar1 = pcVar1 + 1) {
      if (n < pcVar1) {
        ::std::operator<<(local_1a8,", ");
      }
      ::std::operator<<(local_1a8,(char4 *)pvVar3);
      pvVar3 = pvVar3 + 4;
    }
  }
  ::std::operator<<(local_1a8,"]");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const T *vals, size_t n, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}